

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlChar * xmlCatalogListXMLResolveURI(xmlCatalogEntryPtr catal,xmlChar *URI)

{
  xmlGenericErrorFunc p_Var1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  long lVar9;
  _xmlCatalogEntry *p_Var10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  _xmlCatalogEntry *local_1f0;
  uint local_1dc;
  xmlCatalogEntryPtr local_1d0;
  undefined8 auStack_1c8 [51];
  
  if (catal != (xmlCatalogEntryPtr)0x0) {
    iVar3 = xmlStrncmp(URI,(xmlChar *)"urn:publicid:",0xd);
    if (iVar3 == 0) {
      pxVar7 = xmlCatalogUnWrapURN(URI);
      if (xmlDebugCatalogs != 0) {
        pp_Var5 = __xmlGenericError();
        p_Var1 = *pp_Var5;
        ppvVar6 = __xmlGenericErrorContext();
        if (pxVar7 == (xmlChar *)0x0) {
          pcVar2 = "Public URN ID %s expanded to NULL\n";
        }
        else {
          pcVar2 = "Public URN ID expanded to %s\n";
          URI = pxVar7;
        }
        (*p_Var1)(*ppvVar6,pcVar2 + 7,URI);
      }
      pxVar8 = xmlCatalogListXMLResolve(catal,pxVar7,(xmlChar *)0x0);
      if (pxVar7 == (xmlChar *)0x0) {
        return pxVar8;
      }
      (*xmlFree)(pxVar7);
      return pxVar8;
    }
    for (; catal != (xmlCatalogEntryPtr)0x0; catal = catal->next) {
      if (catal->type == XML_CATA_CATALOG) {
        local_1f0 = catal->children;
        if (local_1f0 == (_xmlCatalogEntry *)0x0) {
          xmlFetchXMLCatalogFile(catal);
          local_1f0 = catal->children;
          if (local_1f0 == (_xmlCatalogEntry *)0x0) goto LAB_0013aa09;
        }
        if (local_1f0->depth < 0x33) {
          iVar3 = 0;
          iVar13 = 0;
          local_1d0 = (xmlCatalogEntryPtr)0x0;
          local_1dc = 0;
          for (p_Var10 = local_1f0; p_Var10 != (xmlCatalogEntryPtr)0x0; p_Var10 = p_Var10->next) {
            switch(p_Var10->type) {
            case XML_CATA_NEXT_CATALOG:
              iVar13 = iVar13 + 1;
              break;
            case XML_CATA_URI:
              iVar4 = xmlStrEqual(URI,p_Var10->name);
              if (iVar4 != 0) {
                if (xmlDebugCatalogs != 0) {
                  pp_Var5 = __xmlGenericError();
                  p_Var1 = *pp_Var5;
                  ppvVar6 = __xmlGenericErrorContext();
                  (*p_Var1)(*ppvVar6,"Found URI match %s\n",p_Var10->name);
                }
                pxVar7 = xmlStrdup(p_Var10->URL);
                goto LAB_0013aa04;
              }
              break;
            case XML_CATA_REWRITE_URI:
              uVar14 = xmlStrlen(p_Var10->name);
              if (((int)local_1dc < (int)uVar14) &&
                 (iVar4 = xmlStrncmp(URI,p_Var10->name,uVar14), iVar4 == 0)) {
                local_1dc = uVar14;
                local_1d0 = p_Var10;
              }
              break;
            case XML_CATA_DELEGATE_URI:
              pxVar7 = p_Var10->name;
              iVar4 = xmlStrlen(pxVar7);
              iVar4 = xmlStrncmp(URI,pxVar7,iVar4);
              iVar3 = iVar3 + (uint)(iVar4 == 0);
            }
          }
          if (local_1d0 == (xmlCatalogEntryPtr)0x0) {
            if (iVar3 != 0) {
              uVar14 = 0;
              do {
                uVar12 = 0;
                if (0 < (int)uVar14) {
                  uVar12 = (ulong)uVar14;
                }
                while( true ) {
                  if (local_1f0 == (xmlCatalogEntryPtr)0x0) {
                    return (xmlChar *)0xffffffffffffffff;
                  }
                  if ((local_1f0->type != XML_CATA_DELEGATE_URI) &&
                     (local_1f0->type != XML_CATA_DELEGATE_SYSTEM)) break;
                  pxVar7 = local_1f0->name;
                  iVar3 = xmlStrlen(pxVar7);
                  iVar3 = xmlStrncmp(URI,pxVar7,iVar3);
                  if (iVar3 != 0) break;
                  uVar11 = 0;
                  do {
                    if (uVar12 == uVar11) {
                      if ((int)uVar14 < 0x32) {
                        lVar9 = (long)(int)uVar14;
                        uVar14 = uVar14 + 1;
                        auStack_1c8[lVar9] = local_1f0->URL;
                      }
                      p_Var10 = local_1f0->children;
                      if (p_Var10 == (_xmlCatalogEntry *)0x0) {
                        xmlFetchXMLCatalogFile(local_1f0);
                        p_Var10 = local_1f0->children;
                        if (p_Var10 == (_xmlCatalogEntry *)0x0) goto LAB_0013ab9e;
                      }
                      if (xmlDebugCatalogs != 0) {
                        pp_Var5 = __xmlGenericError();
                        p_Var1 = *pp_Var5;
                        ppvVar6 = __xmlGenericErrorContext();
                        (*p_Var1)(*ppvVar6,"Trying URI delegate %s\n",local_1f0->URL);
                        p_Var10 = local_1f0->children;
                      }
                      pxVar7 = xmlCatalogListXMLResolveURI(p_Var10,URI);
                      if (pxVar7 != (xmlChar *)0x0) {
                        return pxVar7;
                      }
                      goto LAB_0013ab9e;
                    }
                    iVar3 = xmlStrEqual(local_1f0->URL,(xmlChar *)auStack_1c8[uVar11]);
                    uVar11 = uVar11 + 1;
                  } while (iVar3 == 0);
                  local_1f0 = local_1f0->next;
                }
LAB_0013ab9e:
                local_1f0 = local_1f0->next;
              } while( true );
            }
            if (iVar13 != 0) {
              for (; local_1f0 != (xmlCatalogEntryPtr)0x0; local_1f0 = local_1f0->next) {
                if (local_1f0->type == XML_CATA_NEXT_CATALOG) {
                  p_Var10 = local_1f0->children;
                  if (p_Var10 == (_xmlCatalogEntry *)0x0) {
                    xmlFetchXMLCatalogFile(local_1f0);
                    p_Var10 = local_1f0->children;
                    if (p_Var10 == (_xmlCatalogEntry *)0x0) goto LAB_0013a9c6;
                  }
                  pxVar7 = xmlCatalogListXMLResolveURI(p_Var10,URI);
                  if (pxVar7 != (xmlChar *)0x0) {
                    return pxVar7;
                  }
                }
LAB_0013a9c6:
              }
            }
          }
          else {
            if (xmlDebugCatalogs != 0) {
              pp_Var5 = __xmlGenericError();
              p_Var1 = *pp_Var5;
              ppvVar6 = __xmlGenericErrorContext();
              (*p_Var1)(*ppvVar6,"Using rewriting rule %s\n",local_1d0->name);
            }
            pxVar7 = xmlStrdup(local_1d0->URL);
            if (pxVar7 != (xmlChar *)0x0) {
              pxVar7 = xmlStrcat(pxVar7,URI + local_1dc);
LAB_0013aa04:
              if (pxVar7 != (xmlChar *)0x0) {
                return pxVar7;
              }
            }
          }
        }
        else {
          xmlCatalogErr(local_1f0,(xmlNodePtr)0x0,0x676,"Detected recursion in catalog %s\n",
                        local_1f0->name,(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
LAB_0013aa09:
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlCatalogListXMLResolveURI(xmlCatalogEntryPtr catal, const xmlChar *URI) {
    xmlChar *ret = NULL;
    xmlChar *urnID = NULL;

    if (catal == NULL)
        return(NULL);
    if (URI == NULL)
	return(NULL);

    if (!xmlStrncmp(URI, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(URI);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlGenericError(xmlGenericErrorContext,
			"URN ID %s expanded to NULL\n", URI);
	    else
		xmlGenericError(xmlGenericErrorContext,
			"URN ID expanded to %s\n", urnID);
	}
	ret = xmlCatalogListXMLResolve(catal, urnID, NULL);
	if (urnID != NULL)
	    xmlFree(urnID);
	return(ret);
    }
    while (catal != NULL) {
	if (catal->type == XML_CATA_CATALOG) {
	    if (catal->children == NULL) {
		xmlFetchXMLCatalogFile(catal);
	    }
	    if (catal->children != NULL) {
		ret = xmlCatalogXMLResolveURI(catal->children, URI);
		if (ret != NULL)
		    return(ret);
	    }
	}
	catal = catal->next;
    }
    return(ret);
}